

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1359::run(TestCase1359 *this)

{
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  StructReader local_2c8;
  Builder root_1;
  Builder root;
  Builder local_230;
  Builder local_208;
  Builder local_1e0;
  Reader local_1b8;
  SegmentReader *local_188;
  CapTableReader *pCStack_180;
  void *local_178;
  WirePointer *pWStack_170;
  StructDataBitCount local_168;
  StructPointerCount SStack_164;
  undefined2 uStack_162;
  int iStack_160;
  undefined4 uStack_15c;
  Reader local_158;
  Reader local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<TestImport>(&root,&builder.super_MessageBuilder);
  TestImport::Builder::initField(&local_1e0,&root);
  builder_00._builder.capTable = local_1e0._builder.capTable;
  builder_00._builder.segment = local_1e0._builder.segment;
  builder_00._builder.data = local_1e0._builder.data;
  builder_00._builder.pointers = local_1e0._builder.pointers;
  builder_00._builder.dataSize = local_1e0._builder.dataSize;
  builder_00._builder.pointerCount = local_1e0._builder.pointerCount;
  builder_00._builder._38_2_ = local_1e0._builder._38_2_;
  initTestMessage(builder_00);
  StructBuilder::asReader(&root._builder);
  TestImport::Reader::getField(&local_128,(Reader *)&local_2c8);
  reader._reader.capTable = local_128._reader.capTable;
  reader._reader.segment = local_128._reader.segment;
  reader._reader.data = local_128._reader.data;
  reader._reader.pointers = local_128._reader.pointers;
  reader._reader.dataSize = local_128._reader.dataSize;
  reader._reader.pointerCount = local_128._reader.pointerCount;
  reader._reader._38_2_ = local_128._reader._38_2_;
  reader._reader.nestingLimit = local_128._reader.nestingLimit;
  reader._reader._44_4_ = local_128._reader._44_4_;
  checkTestMessage(reader);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<TestImport2>(&root_1,&builder.super_MessageBuilder);
  TestImport2::Builder::initFoo(&local_208,&root_1);
  builder_01._builder.capTable = local_208._builder.capTable;
  builder_01._builder.segment = local_208._builder.segment;
  builder_01._builder.data = local_208._builder.data;
  builder_01._builder.pointers = local_208._builder.pointers;
  builder_01._builder.dataSize = local_208._builder.dataSize;
  builder_01._builder.pointerCount = local_208._builder.pointerCount;
  builder_01._builder._38_2_ = local_208._builder._38_2_;
  initTestMessage(builder_01);
  StructBuilder::asReader(&root_1._builder);
  TestImport2::Reader::getFoo(&local_158,(Reader *)&local_2c8);
  reader_00._reader.capTable = local_158._reader.capTable;
  reader_00._reader.segment = local_158._reader.segment;
  reader_00._reader.data = local_158._reader.data;
  reader_00._reader.pointers = local_158._reader.pointers;
  reader_00._reader.dataSize = local_158._reader.dataSize;
  reader_00._reader.pointerCount = local_158._reader.pointerCount;
  reader_00._reader._38_2_ = local_158._reader._38_2_;
  reader_00._reader.nestingLimit = local_158._reader.nestingLimit;
  reader_00._reader._44_4_ = local_158._reader._44_4_;
  checkTestMessage(reader_00);
  schemaProto<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
            ();
  local_2c8.dataSize = local_168;
  local_2c8.pointerCount = SStack_164;
  local_2c8._38_2_ = uStack_162;
  local_2c8.nestingLimit = iStack_160;
  local_2c8._44_4_ = uStack_15c;
  local_2c8.data = local_178;
  local_2c8.pointers = pWStack_170;
  local_2c8.segment = local_188;
  local_2c8.capTable = pCStack_180;
  root._builder.data = root_1._builder.pointers + 1;
  root._builder.segment = root_1._builder.segment;
  root._builder.capTable = root_1._builder.capTable;
  PointerBuilder::setStruct((PointerBuilder *)&root,&local_2c8,false);
  TestImport2::Builder::initBaz((Builder *)&local_2c8,&root_1);
  TestImport::Builder::initField(&local_230,(Builder *)&local_2c8);
  builder_02._builder.capTable = local_230._builder.capTable;
  builder_02._builder.segment = local_230._builder.segment;
  builder_02._builder.data = local_230._builder.data;
  builder_02._builder.pointers = local_230._builder.pointers;
  builder_02._builder.dataSize = local_230._builder.dataSize;
  builder_02._builder.pointerCount = local_230._builder.pointerCount;
  builder_02._builder._38_2_ = local_230._builder._38_2_;
  initTestMessage(builder_02);
  StructBuilder::asReader(&root_1._builder);
  TestImport2::Reader::getBaz((Reader *)&local_2c8,(Reader *)&root);
  TestImport::Reader::getField(&local_1b8,(Reader *)&local_2c8);
  reader_01._reader.capTable = local_1b8._reader.capTable;
  reader_01._reader.segment = local_1b8._reader.segment;
  reader_01._reader.data = local_1b8._reader.data;
  reader_01._reader.pointers = local_1b8._reader.pointers;
  reader_01._reader.dataSize = local_1b8._reader.dataSize;
  reader_01._reader.pointerCount = local_1b8._reader.pointerCount;
  reader_01._reader._38_2_ = local_1b8._reader._38_2_;
  reader_01._reader.nestingLimit = local_1b8._reader.nestingLimit;
  reader_01._reader._44_4_ = local_1b8._reader._44_4_;
  checkTestMessage(reader_01);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, Imports) {
  // Also just testing the generated code.

  {
    MallocMessageBuilder builder;
    TestImport::Builder root = builder.getRoot<TestImport>();
    initTestMessage(root.initField());
    checkTestMessage(root.asReader().getField());
  }

  {
    MallocMessageBuilder builder;
    TestImport2::Builder root = builder.getRoot<TestImport2>();
    initTestMessage(root.initFoo());
    checkTestMessage(root.asReader().getFoo());
    root.setBar(schemaProto<TestAllTypes>());
    initTestMessage(root.initBaz().initField());
    checkTestMessage(root.asReader().getBaz().getField());
  }
}